

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void copyvarinfo(rnnvarinfo *dst,rnnvarinfo *src)

{
  int iVar1;
  char *pcVar2;
  rnnvarset **pprVar3;
  rnnvarset *prVar4;
  int iVar5;
  long lVar6;
  
  dst->varsets = (rnnvarset **)0x0;
  dst->varsetsnum = 0;
  dst->varsetsmax = 0;
  dst->prefenum = (rnnenum *)0x0;
  dst->prefix = (char *)0x0;
  dst->variantsstr = (char *)0x0;
  *(undefined8 *)&dst->dead = 0;
  dst->prefixstr = (char *)0x0;
  dst->varsetstr = (char *)0x0;
  if (src->prefix != (char *)0x0) {
    pcVar2 = strdup(src->prefix);
    dst->prefix = pcVar2;
  }
  if (src->prefixstr != (char *)0x0) {
    pcVar2 = strdup(src->prefixstr);
    dst->prefixstr = pcVar2;
  }
  if (src->varsetstr != (char *)0x0) {
    pcVar2 = strdup(src->varsetstr);
    dst->varsetstr = pcVar2;
  }
  if (src->variantsstr != (char *)0x0) {
    pcVar2 = strdup(src->variantsstr);
    dst->variantsstr = pcVar2;
  }
  dst->dead = src->dead;
  dst->prefenum = src->prefenum;
  iVar5 = 0;
  for (lVar6 = 0; lVar6 < src->varsetsnum; lVar6 = lVar6 + 1) {
    iVar1 = dst->varsetsmax;
    if (iVar1 <= iVar5) {
      iVar5 = iVar1 * 2;
      if (iVar1 == 0) {
        iVar5 = 0x10;
      }
      dst->varsetsmax = iVar5;
      pprVar3 = (rnnvarset **)realloc(dst->varsets,(long)iVar5 << 3);
      dst->varsets = pprVar3;
    }
    prVar4 = copyvarset(src->varsets[lVar6]);
    iVar1 = dst->varsetsnum;
    iVar5 = iVar1 + 1;
    dst->varsetsnum = iVar5;
    dst->varsets[iVar1] = prVar4;
  }
  return;
}

Assistant:

static void copyvarinfo (struct rnnvarinfo *dst, struct rnnvarinfo *src) {
	int i;
	memset(dst, 0, sizeof(*dst));
	if (src->prefix)
		dst->prefix = strdup(src->prefix);
	if (src->prefixstr)
		dst->prefixstr = strdup(src->prefixstr);
	if (src->varsetstr)
		dst->varsetstr = strdup(src->varsetstr);
	if (src->variantsstr)
		dst->variantsstr = strdup(src->variantsstr);
	dst->dead = src->dead;
	dst->prefenum = src->prefenum;

	for (i = 0; i < src->varsetsnum; i++)
		ADDARRAY(dst->varsets, copyvarset(src->varsets[i]));
}